

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallBinary(void)

{
  JL_STATUS JVar1;
  int iVar2;
  bool bVar3;
  _Bool _result_42;
  _Bool _result_41;
  _Bool _result_40;
  _Bool _result_39;
  _Bool _result_38;
  _Bool _result_37;
  _Bool _result_36;
  _Bool _result_35;
  _Bool _result_34;
  _Bool _result_33;
  _Bool _result_32;
  _Bool _result_31;
  _Bool _result_30;
  _Bool _result_29;
  _Bool _result_28;
  _Bool _result_27;
  _Bool _result_26;
  _Bool _result_25;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  uint8_t zero10 [10];
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  TestStruct2 theStruct2;
  JlMarshallElement marshalTestStruct2 [3];
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  size_t sStack_f8;
  _Bool _result;
  size_t errorAtPos;
  TestStruct theStruct;
  JlMarshallElement marshalTestStruct [2];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&theStruct.BinaryBlob2,&DAT_0014f710,0xc0);
  memset(&errorAtPos,0,0x18);
  sStack_f8 = 0;
  JVar1 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}",
                         (JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67b);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67c);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp(&errorAtPos,"ThisIsTest",10);
  WjTestLib_Assert(iVar2 == 0,"memcmp( theStruct.FixedBlob, \"ThisIsTest\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67e);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct._8_8_ == 0x123456789abcdef0,
                   "0x123456789ABCDEF0ULL == theStruct.BinaryBlob2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67f);
  if (theStruct._8_8_ != 0x123456789abcdef0) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlUnmarshallFreeStructAllocs((JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x681);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  memcpy(&theStruct2.VariableBlob3Size,&DAT_0014f7d0,0x120);
  memset(&_result_12,0,0x30);
  JVar1 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}"
                         ,(JlMarshallElement *)&theStruct2.VariableBlob3Size,3,&_result_12,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x699);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69a);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_12 != (void *)0x0;
  WjTestLib_Assert(bVar3,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69c);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob1 == (uint8_t *)0xa;
  WjTestLib_Assert(bVar3,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69d);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp(__result_12,"1234567890",10);
  WjTestLib_Assert(iVar2 == 0,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69e);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[9] = theStruct2.VariableBlob1Size != 0;
  WjTestLib_Assert((_Bool)zero10[9],"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a0);
  if ((zero10[9] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[8] = theStruct2.VariableBlob2 == (void *)0x1a;
  WjTestLib_Assert((_Bool)zero10[8],"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a1);
  if ((zero10[8] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp((void *)theStruct2.VariableBlob1Size,"1234567890AAAABBBBCCCCDDDD",0x1a);
  zero10[7] = iVar2 == 0;
  WjTestLib_Assert((_Bool)zero10[7],
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a2);
  if ((zero10[7] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[6] = theStruct2.VariableBlob2Size == 0;
  WjTestLib_Assert((_Bool)zero10[6],"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a4);
  if ((zero10[6] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[5] = theStruct2.VariableBlob3 == (uint32_t *)0x0;
  WjTestLib_Assert((_Bool)zero10[5],"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a5);
  if ((zero10[5] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{VariableBlob1:\'AAAAAAAAAAAAAA\'}",
                         (JlMarshallElement *)&theStruct2.VariableBlob3Size,3,&_result_12,
                         &stack0xffffffffffffff08);
  zero10[4] = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)zero10[4],
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'AAAAAAAAAAAAAA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6aa);
  if ((zero10[4] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[3] = sStack_f8 == 0;
  WjTestLib_Assert((_Bool)zero10[3],"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ab);
  if ((zero10[3] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  zero10[2] = theStruct2.VariableBlob1 == (uint8_t *)0xa;
  WjTestLib_Assert((_Bool)zero10[2],"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ad);
  if ((zero10[2] & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  memset(&_result_25,0,10);
  iVar2 = memcmp(__result_12,&_result_25,10);
  WjTestLib_Assert(iVar2 == 0,"memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6af);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob1Size != 0;
  WjTestLib_Assert(bVar3,"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b1);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob2 == (void *)0x1a;
  WjTestLib_Assert(bVar3,"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b2);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp((void *)theStruct2.VariableBlob1Size,"1234567890AAAABBBBCCCCDDDD",0x1a);
  WjTestLib_Assert(iVar2 == 0,
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b3);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob2Size == 0;
  WjTestLib_Assert(bVar3,"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b5);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob3 == (uint32_t *)0x0;
  WjTestLib_Assert(bVar3,"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b6);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}"
                         ,(JlMarshallElement *)&theStruct2.VariableBlob3Size,3,&_result_12,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ba);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bb);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_12 != (void *)0x0;
  WjTestLib_Assert(bVar3,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bd);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct2.VariableBlob1 == (uint8_t *)0xa,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6be);
  if (theStruct2.VariableBlob1 != (uint8_t *)0xa) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp(__result_12,"1234567890",10);
  WjTestLib_Assert(iVar2 == 0,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bf);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct2.VariableBlob1Size == 0,"(theStruct2.VariableBlob2) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c1);
  if (theStruct2.VariableBlob1Size != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct2.VariableBlob2 == (void *)0x0,"0 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c2);
  if (theStruct2.VariableBlob2 != (void *)0x0) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct2.VariableBlob2Size != 0;
  WjTestLib_Assert(bVar3,"(theStruct2.VariableBlob3) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c4);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct2.VariableBlob3 == (uint32_t *)0xa,"10 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c5);
  if (theStruct2.VariableBlob3 != (uint32_t *)0xa) {
    local_c = WJTL_STATUS_FAILED;
  }
  iVar2 = memcmp((void *)theStruct2.VariableBlob2Size,"1234567890",10);
  WjTestLib_Assert(iVar2 == 0,"memcmp( theStruct2.VariableBlob3, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c6);
  if (iVar2 != 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlUnmarshallFreeStructAllocs
                    ((JlMarshallElement *)&theStruct2.VariableBlob3Size,3,&_result_12);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c8);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}",
                         (JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6cd);
  if (JVar1 != JL_STATUS_INVALID_DATA) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0x25;
  WjTestLib_Assert(bVar3,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ce);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}",
                         (JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d3);
  if (JVar1 != JL_STATUS_INVALID_DATA) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0x25;
  WjTestLib_Assert(bVar3,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d4);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}",
                         (JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d9);
  if (JVar1 != JL_STATUS_INVALID_DATA) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0x25;
  WjTestLib_Assert(bVar3,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6da);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}"
                         ,(JlMarshallElement *)&theStruct.BinaryBlob2,2,&errorAtPos,
                         &stack0xffffffffffffff08);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6df);
  if (JVar1 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_f8 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6e0);
  if (!bVar3) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallBinary
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t     FixedBlob[10];      // Treat as 80bit binary
        uint64_t    BinaryBlob2;        // Treat as 64bit binary
    } TestStruct;

    JlMarshallElement marshalTestStruct[] =
    {
        JlMarshallBinaryFixed( TestStruct, FixedBlob, "FixedBlob" ),
        JlMarshallBinaryFixed( TestStruct, BinaryBlob2, "BinaryBlob2" ),
    };

    TestStruct theStruct = {{0}};
    size_t errorAtPos = 0;

    // Test success
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA',BinaryBlob2:'8N68mnhWNBI'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( memcmp( theStruct.FixedBlob, "ThisIsTest", 10 ) == 0 );
    JL_ASSERT( 0x123456789ABCDEF0ULL == theStruct.BinaryBlob2 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct, NumElements(marshalTestStruct), &theStruct ) );

    // Now Test with variable sized binary
    typedef struct
    {
        uint8_t*    VariableBlob1;
        size_t      VariableBlob1Size;
        void*       VariableBlob2;
        size_t      VariableBlob2Size;
        uint32_t*   VariableBlob3;
        size_t      VariableBlob3Size;
    } TestStruct2;

    JlMarshallElement marshalTestStruct2[] =
    {
        JlMarshallBinary( TestStruct2, VariableBlob1, VariableBlob1Size, "VariableBlob1" ),
        JlMarshallBinary( TestStruct2, VariableBlob2, VariableBlob2Size, "VariableBlob2" ),
        JlMarshallBinary( TestStruct2, VariableBlob3, VariableBlob3Size, "VariableBlob3" ),
    };

    TestStruct2 theStruct2 = {0};

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ',VariableBlob3:null}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    // Now test loading in different data and making sure no memory leak
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'AAAAAAAAAAAAAA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    uint8_t zero10[10] = {0};
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:null,VariableBlob3:'MTIzNDU2Nzg5MA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 0 == theStruct2.VariableBlob2Size );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 10 == theStruct2.VariableBlob3Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob3, "1234567890", 10 ) == 0 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2 ) );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'c0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhpVGhpc0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhp%0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test padding character
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA===',BinaryBlob2:'8N68mnhWNBI==Anything ignored after padding'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    return TestReturn;
}